

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int get_str_opt(archive_write *a,archive_string *s,size_t maxsize,char *key,char *value)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = strlen(value);
  if (maxsize < sVar1) {
    archive_set_error(&a->archive,-1,"Value is longer than %zu characters for option ``%s\'\'",
                      maxsize,key);
    iVar2 = -0x1e;
  }
  else {
    s->length = 0;
    iVar2 = 0;
    if (value == (char *)0x0) {
      sVar1 = 0;
    }
    else {
      sVar1 = strlen(value);
    }
    archive_strncat(s,value,sVar1);
  }
  return iVar2;
}

Assistant:

static int
get_str_opt(struct archive_write *a, struct archive_string *s,
    size_t maxsize, const char *key, const char *value)
{

	if (strlen(value) > maxsize) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Value is longer than %zu characters "
		    "for option ``%s''", maxsize, key);
		return (ARCHIVE_FATAL);
	}
	archive_strcpy(s, value);
	return (ARCHIVE_OK);
}